

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O1

string * markdown::token::RawText::_processHtmlTagAttributes
                   (string *__return_storage_ptr__,string *src,ReplacementTable *replacements)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  size_t sVar5;
  long *plVar6;
  TextHolder *p;
  long *plVar7;
  element_type *peVar8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  ulong uVar10;
  char *pcVar11;
  smatch mtag;
  string tgttag;
  string fulltag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  smatch m;
  undefined1 local_1f8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1d0;
  bool local_1c8;
  element_type *local_1c0;
  shared_count sStack_1b8;
  int local_1b0;
  bool local_1ac;
  undefined8 local_1a0;
  long local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  char local_176 [6];
  char *local_170;
  char *local_168;
  shared_ptr<markdown::Token> local_160;
  element_type local_150;
  long lStack_148;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  char *local_120;
  long local_118;
  char local_110;
  undefined7 uStack_10f;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
  *local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> local_a0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  
  local_a8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  _Var9._M_current = (src->_M_dataplus)._M_p;
  local_c0._M_current = _Var9._M_current + src->_M_string_length;
  local_b8 = (vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
              *)replacements;
  do {
    if ((_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
         ::cHtmlToken == '\0') &&
       (iVar3 = __cxa_guard_acquire(&_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
                                     ::cHtmlToken), iVar3 != 0)) {
      boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
      basic_regex(&_processHtmlTagAttributes::cHtmlToken,
                  "<((/?)([a-zA-Z0-9]+)(?:( +[a-zA-Z0-9]+?(?: ?= ?(\"|\').*?\\5))+? */? *))>",0);
      __cxa_atexit(boost::
                   basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                   ~basic_regex,&_processHtmlTagAttributes::cHtmlToken,&__dso_handle);
      __cxa_guard_release(&_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
                           ::cHtmlToken);
    }
    local_88.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_88.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.m_base._M_current = (char *)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_null.matched = false;
    local_88.m_named_subs.px = (element_type *)0x0;
    local_88.m_named_subs.pn.pi_ = (sp_counted_base *)0x0;
    local_88.m_last_closed_paren = 0;
    local_88.m_is_singular = true;
    bVar1 = boost::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                      (_Var9,local_c0,&local_88,&_processHtmlTagAttributes::cHtmlToken,
                       format_default,_Var9);
    if (bVar1) {
      pvVar4 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,3);
      if (pvVar4->matched == true) {
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_1f8,
                   (pvVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (pvVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_1f8._0_8_ = local_1f8 + 0x10;
        local_1f8._8_8_ = (pointer)0x0;
        local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
      }
      sVar5 = isValidTag((string *)local_1f8,false);
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      if (sVar5 == 0) {
        pvVar4 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,0);
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_1f8,_Var9._M_current,
                   (pvVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1f8._0_8_);
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        pvVar4 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,0);
        _Var9._M_current =
             (pvVar4->
             super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).second._M_current;
      }
      else {
        pvVar4 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,0);
        local_1f8._0_8_ = local_1f8 + 0x10;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_1f8,_Var9._M_current,
                   (pvVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1f8._0_8_);
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        pvVar4 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,0);
        if (pvVar4->matched == true) {
          local_120 = &local_110;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_120,
                     (pvVar4->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar4->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_120 = &local_110;
          local_118 = 0;
          local_110 = '\0';
        }
        local_140 = &local_130;
        local_138 = 0;
        local_130 = 0;
        local_b0._M_current = local_120 + local_118;
        _Var9._M_current = local_120;
        do {
          if ((_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
               ::cAttributeStrings == '\0') &&
             (iVar3 = __cxa_guard_acquire(&_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
                                           ::cAttributeStrings), iVar3 != 0)) {
            boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
            basic_regex(&_processHtmlTagAttributes::cAttributeStrings,"= ?(\"|\').*?\\1",0);
            __cxa_atexit(boost::
                         basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                         ::~basic_regex,&_processHtmlTagAttributes::cAttributeStrings,&__dso_handle)
            ;
            __cxa_guard_release(&_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
                                 ::cAttributeStrings);
          }
          local_1d8._M_current = (char *)0x0;
          _Stack_1d0._M_current = (char *)0x0;
          local_1f8._16_8_ = 0;
          local_1f8._24_8_ = 0;
          local_1f8._0_8_ = (char *)0x0;
          local_1f8._8_8_ = (pointer)0x0;
          local_1c8 = false;
          local_1c0 = (element_type *)0x0;
          sStack_1b8.pi_ = (sp_counted_base *)0x0;
          local_1b0 = 0;
          local_1ac = true;
          bVar2 = boost::
                  regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                            (_Var9,local_b0,
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_1f8,&_processHtmlTagAttributes::cAttributeStrings,
                             format_default,_Var9);
          if (bVar2) {
            pvVar4 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_1f8,0);
            local_1a0 = &local_190;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_1a0,_Var9._M_current,
                       (pvVar4->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current);
            std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_1a0);
            if (local_1a0 != &local_190) {
              operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
            }
            local_a0.m_value = (long)*(pointer *)(local_b8 + 8) - *(long *)local_b8 >> 4;
            local_d8 = (char *)0x0;
            local_d0 = 0;
            local_170 = (char *)((long)&local_1a0 + 2);
            local_a0.m_czero = '0';
            local_a0.m_zero = 0x30;
            local_168 = local_176;
            local_e0 = &local_d0;
            local_a0.m_finish = local_176;
            local_170 = boost::detail::
                        lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::convert
                                  (&local_a0);
            local_168 = local_176;
            std::__cxx11::string::replace((ulong)&local_e0,0,local_d8,(ulong)local_170);
            plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x158235);
            local_100 = &local_f0;
            plVar7 = plVar6 + 2;
            if ((long *)*plVar6 == plVar7) {
              local_f0 = *plVar7;
              lStack_e8 = plVar6[3];
            }
            else {
              local_f0 = *plVar7;
              local_100 = (long *)*plVar6;
            }
            local_f8 = plVar6[1];
            *plVar6 = (long)plVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
            local_160.px = &local_150;
            peVar8 = (element_type *)(plVar6 + 2);
            if ((element_type *)*plVar6 == peVar8) {
              local_150._vptr_Token = peVar8->_vptr_Token;
              lStack_148 = plVar6[3];
            }
            else {
              local_150._vptr_Token = peVar8->_vptr_Token;
              local_160.px = (element_type *)*plVar6;
            }
            local_160.pn.pi_ = (sp_counted_base *)plVar6[1];
            *plVar6 = (long)peVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_160.px);
            if (local_160.px != &local_150) {
              operator_delete(local_160.px,(long)local_150._vptr_Token + 1);
            }
            if (local_100 != &local_f0) {
              operator_delete(local_100,local_f0 + 1);
            }
            if (local_e0 != &local_d0) {
              operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
            }
            pvVar4 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_1f8,0);
            _Var9._M_current =
                 (pvVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current;
            p = (TextHolder *)operator_new(0x30);
            pvVar4 = boost::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)local_1f8,0);
            if (pvVar4->matched == true) {
              local_1a0 = &local_190;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_1a0,
                         (pvVar4->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).first._M_current,
                         (pvVar4->
                         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ).second._M_current);
            }
            else {
              local_1a0 = &local_190;
              local_198 = 0;
              local_190 = 0;
            }
            (p->super_Token)._vptr_Token = (_func_int **)&PTR__TextHolder_001682d0;
            (p->mText)._M_dataplus._M_p = (pointer)&(p->mText).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&p->mText,local_1a0,local_1a0 + local_198);
            p->mCanContainMarkup = false;
            p->mEncodingFlags = 5;
            boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::TextHolder>
                      (&local_160,p);
            std::
            vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
            ::emplace_back<boost::shared_ptr<markdown::Token>>(local_b8,&local_160);
            boost::detail::shared_count::~shared_count(&local_160.pn);
            if (local_1a0 != &local_190) {
              operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
            }
          }
          else {
            local_1a0 = &local_190;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_1a0,_Var9._M_current,local_b0._M_current);
            std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_1a0);
            if (local_1a0 != &local_190) {
              operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
            }
          }
          boost::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_1f8);
        } while (bVar2);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_140);
        pvVar4 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&local_88,0);
        _Var9._M_current =
             (pvVar4->
             super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).second._M_current;
        if (local_140 != &local_130) {
          operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
        }
        if (local_120 != &local_110) {
          uVar10 = CONCAT71(uStack_10f,local_110);
          pcVar11 = local_120;
          goto LAB_00148509;
        }
      }
    }
    else {
      local_1f8._0_8_ = local_1f8 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_1f8,_Var9._M_current,local_c0._M_current);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1f8._0_8_);
      uVar10 = local_1f8._16_8_;
      pcVar11 = (char *)local_1f8._0_8_;
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
LAB_00148509:
        operator_delete(pcVar11,uVar10 + 1);
      }
    }
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results(&local_88);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string RawText::_processHtmlTagAttributes(std::string src, ReplacementTable&
	replacements)
{
	// Because "Attribute Content Is Not A Code Span"
	std::string tgt;
	std::string::const_iterator prev=src.begin(), end=src.end();
	while (1) {
		static const boost::regex cHtmlToken("<((/?)([a-zA-Z0-9]+)(?:( +[a-zA-Z0-9]+?(?: ?= ?(\"|').*?\\5))+? */? *))>");
		boost::smatch m;
		if (boost::regex_search(prev, end, m, cHtmlToken)) {
			// NOTE: Kludge alert! The `isValidTag` test is a cheat, only here
			// to handle some edge cases between the Markdown test suite and the
			// PHP-Markdown one, which seem to conflict.
			if (isValidTag(m[3])) {
				tgt+=std::string(prev, m[0].first);

				std::string fulltag=m[0], tgttag;
				std::string::const_iterator prevtag=fulltag.begin(), endtag=fulltag.end();
				while (1) {
					static const boost::regex cAttributeStrings("= ?(\"|').*?\\1");
					boost::smatch mtag;
					if (boost::regex_search(prevtag, endtag, mtag, cAttributeStrings)) {
						tgttag+=std::string(prevtag, mtag[0].first);
						tgttag+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@htmlTagAttr\x01";
						prevtag=mtag[0].second;

						replacements.push_back(TokenPtr(new TextHolder(std::string(mtag[0]), false, cAmps|cAngles)));
					} else {
						tgttag+=std::string(prevtag, endtag);
						break;
					}
				}
				tgt+=tgttag;
				prev=m[0].second;
			} else {
				tgt+=std::string(prev, m[0].second);
				prev=m[0].second;
			}
		} else {
			tgt+=std::string(prev, end);
			break;
		}
	}

	return tgt;
}